

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  ulong uVar1;
  TestInfo *pTVar2;
  InternalRunDeathTestFlag *pIVar3;
  _union_1457 _Var4;
  size_type *psVar5;
  int iVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  int *piVar9;
  void *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar13;
  undefined8 uVar14;
  const_iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  size_t __len;
  int pipe_fd [2];
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  string filter_flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  int local_210;
  int local_20c;
  string local_208;
  int local_1e4;
  string local_1e0;
  size_type *local_1c0;
  size_type local_1b8;
  size_type local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  _union_1457 local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  _union_1457 local_e8;
  undefined1 local_e0 [8];
  size_type local_d8;
  ulong uStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  UnitTest::GetInstance();
  pTVar2 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1e4 = (pTVar2->result_).death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar6 = pipe(&local_210);
  if (iVar6 == -1) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,
                        "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p == paVar11) {
      local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    }
    else {
      local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_310._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_310,", line ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar11) {
      local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p._0_4_ = 0x589;
    StreamableToString<int>(&local_290,(int *)&local_270);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar14 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_2d0._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar14 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_290._M_string_length + local_2d0._M_string_length)
      goto LAB_001499d0;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::replace
                         ((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
    }
    else {
LAB_001499d0:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_2d0,local_290._M_dataplus._M_p,local_290._M_string_length);
    }
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar11) {
      local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    paVar11->_M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,": ");
    local_e8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar11) {
      local_d8 = paVar11->_M_allocated_capacity;
      uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
    }
    else {
      local_d8 = paVar11->_M_allocated_capacity;
    }
    local_e0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_e8,"pipe(pipe_fd) != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar11) {
      local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
    }
    local_178 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort((string *)&local_180);
    pbVar8 = extraout_RAX_02;
    local_180 = extraout_RDX_02;
LAB_0014a400:
    local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
  }
  else {
    iVar6 = fcntl(local_20c,2,0);
    if (iVar6 != -1) {
      paVar11 = &local_2f0.field_2;
      local_2f0._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2f0,"gtest_");
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if (paVar15 == paVar12) {
        local_310.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_310.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_310._M_dataplus._M_p = (pointer)paVar15;
      }
      local_310._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_310,"filter");
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if (paVar15 == paVar12) {
        local_2d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2d0._M_dataplus._M_p = (pointer)paVar15;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0,"=");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if (paVar15 == paVar12) {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)paVar15;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0,(pTVar2->test_suite_name_)._M_dataplus._M_p);
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
      _Var4.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar15 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4.sa_handler == paVar15) {
        local_d8 = paVar15->_M_allocated_capacity;
        uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_d8 = paVar15->_M_allocated_capacity;
        local_e8.sa_handler = _Var4.sa_handler;
      }
      local_e0 = (undefined1  [8])pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
                      ,".");
      local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar15 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler == paVar15) {
        local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_180.sa_handler = (__sighandler_t)local_170;
      }
      else {
        local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
      }
      local_178 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_180,(pTVar2->name_)._M_dataplus._M_p);
      paVar15 = &local_40;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if (local_50 == paVar12) {
        local_40._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_40._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_50 = paVar15;
      }
      else {
        local_40._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_48 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      if (local_e8.sa_handler != (__sighandler_t)(local_e0 + 8)) {
        operator_delete(local_e8.sa_handler,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar11) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_230,"gtest_");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar12 == paVar10) {
        local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_250._M_dataplus._M_p = (pointer)paVar12;
      }
      local_250._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,"internal_run_death_test");
      local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == paVar12) {
        local_270.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_270._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,"=");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar12 == paVar10) {
        local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_290._M_dataplus._M_p = (pointer)paVar12;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_290,this->file_);
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar12) {
        local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2f0,"|");
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar12 == paVar10) {
        local_310.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_310.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_310._M_dataplus._M_p = (pointer)paVar12;
      }
      local_310._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>(&local_208,&this->line_);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        uVar14 = local_310.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_208._M_string_length + local_310._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar14 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_208._M_string_length + local_310._M_string_length)
        goto LAB_0014850b;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::replace
                           ((ulong)&local_208,0,(char *)0x0,(ulong)local_310._M_dataplus._M_p);
      }
      else {
LAB_0014850b:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_310,local_208._M_dataplus._M_p,local_208._M_string_length);
      }
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if (paVar10 == paVar12) {
        local_2d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2d0._M_dataplus._M_p = (pointer)paVar10;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      paVar12->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0,"|");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar12 == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)paVar12;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>(&local_1e0,&local_1e4);
      uVar1 = CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length) +
              local_2b0._M_string_length;
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar14 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < uVar1) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          uVar14 = local_1e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < uVar1) goto LAB_00148632;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_00148632:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_2b0,local_1e0._M_dataplus._M_p,
                           CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length
                                   ));
      }
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
      _Var4.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4.sa_handler == paVar12) {
        local_d8 = paVar12->_M_allocated_capacity;
        uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_d8 = paVar12->_M_allocated_capacity;
        local_e8.sa_handler = _Var4.sa_handler;
      }
      local_e0 = (undefined1  [8])pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      paVar12->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
                      ,"|");
      local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler == paVar12) {
        local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_180.sa_handler = (__sighandler_t)local_170;
      }
      else {
        local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
      }
      local_178 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>(&local_1a0,&local_20c);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        uVar14 = local_170[0]._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_178 + local_1a0._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
            &local_1a0.field_2) {
          uVar14 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_178 + local_1a0._M_string_length) goto LAB_00148778;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_180);
      }
      else {
LAB_00148778:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,
                           (char *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                            local_1a0._M_dataplus._M_p._0_4_),
                           local_1a0._M_string_length);
      }
      local_1c0 = &local_1b0;
      psVar5 = (size_type *)(pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5 == paVar12) {
        local_1b0 = paVar12->_M_allocated_capacity;
        uStack_1a8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_1b0 = paVar12->_M_allocated_capacity;
        local_1c0 = psVar5;
      }
      local_1b8 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      paVar12->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
          &local_1a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                        local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      if (local_e8.sa_handler != (__sighandler_t)(local_e0 + 8)) {
        operator_delete(local_e8.sa_handler,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar11) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)&local_208);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_180,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_180);
      __position._M_current = (char **)(local_208._M_string_length - 8);
      local_180.sa_handler = (__sighandler_t)strdup(local_50->_M_local_buf);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,__position,
                 (value_type *)&local_180.sa_handler);
      local_180.sa_handler = (__sighandler_t)strdup((char *)local_1c0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,
                 (char **)(local_208._M_string_length - 8),(value_type *)&local_180.sa_handler);
      local_180.sa_handler = (__sighandler_t)local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e0._M_dataplus._M_p = local_208._M_dataplus._M_p;
      local_1e0._M_string_length._0_4_ = local_210;
      memset(&local_e8,0,0x98);
      sigemptyset((sigset_t *)local_e0);
      local_e8 = (_union_1457)0x1;
      do {
        iVar6 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)&local_180);
        if (iVar6 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar6 = fork();
            if (iVar6 == 0) {
              ExecDeathTestChildMain(&local_1e0);
              goto LAB_00149288;
            }
LAB_00148c51:
            goto LAB_00148c59;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_00149288:
            AssumeRole();
          }
          iVar6 = getpagesize();
          __len = (size_t)(iVar6 * 2);
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CHECK failed: File ","");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_270,
                              "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                             );
            local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p == paVar11) {
              local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_290._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_290,", line ");
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar8->_M_dataplus)._M_p;
            paVar12 = &pbVar8->field_2;
            if (paVar11 != paVar12) goto LAB_00149d00;
            local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            goto LAB_00149d0d;
          }
          lVar13 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar13 = __len - 0x40;
          }
          if (((uint)(iVar6 * 2) < 0x41) || (((ulong)(lVar13 + (long)__addr) & 0x3f) != 0)) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CHECK failed: File ","");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_270,
                              "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                             );
            local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p == paVar11) {
              local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_290._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_290,", line ");
            local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p == paVar11) {
              local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            }
            else {
              local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_2f0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            local_230._M_dataplus._M_p._0_4_ = 0x560;
            StreamableToString<int>(&local_250,(int *)&local_230);
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              uVar14 = local_2f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length) {
              uVar14 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                uVar14 = local_250.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length)
              goto LAB_00149e43;
              pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p)
              ;
            }
            else {
LAB_00149e43:
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_2f0,local_250._M_dataplus._M_p,local_250._M_string_length);
            }
            local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p == paVar11) {
              local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
            }
            else {
              local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_310._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar8->_M_string_length = 0;
            paVar11->_M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_310,": ");
            local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p == paVar11) {
              local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            }
            else {
              local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_2d0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_2d0,
                              "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                             );
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar8->_M_dataplus)._M_p;
            paVar12 = &pbVar8->field_2;
            if (paVar11 != paVar12) goto LAB_0014a5b9;
            local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            goto LAB_0014a5c6;
          }
          iVar6 = clone(ExecDeathTestChildMain,(void *)(lVar13 + (long)__addr),0x11,&local_1e0);
          iVar7 = munmap(__addr,__len);
          if (iVar7 != -1) goto LAB_00148c51;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"CHECK failed: File ","");
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_270,
                          "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                         );
          local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p == paVar11) {
            local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_290._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_290,", line ");
          local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p == paVar11) {
            local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          }
          else {
            local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_2f0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          local_230._M_dataplus._M_p._0_4_ = 0x564;
          StreamableToString<int>(&local_250,(int *)&local_230);
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            uVar14 = local_2f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              uVar14 = local_250.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length)
            goto LAB_00149eec;
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::__cxx11::string::replace
                               ((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
          }
          else {
LAB_00149eec:
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_2f0,local_250._M_dataplus._M_p,local_250._M_string_length);
          }
          local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p == paVar11) {
            local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          }
          else {
            local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_310._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar8->_M_string_length = 0;
          paVar11->_M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_310,": ");
          local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p == paVar11) {
            local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_2d0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_2d0,"munmap(stack, stack_size) != -1");
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar8->_M_dataplus)._M_p;
          paVar12 = &pbVar8->field_2;
          if (paVar11 != paVar12) goto LAB_0014a5e7;
          local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          goto LAB_0014a5f4;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,
                      "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
      local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == paVar11) {
        local_270.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_270._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,", line ");
      local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar11) {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_1a0._M_dataplus._M_p._0_4_ = 0x546;
      StreamableToString<int>(&local_230,(int *)&local_1a0);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar14 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar14 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length)
        goto LAB_00148fdb;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::replace
                           ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
      }
      else {
LAB_00148fdb:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_290,local_230._M_dataplus._M_p,local_230._M_string_length);
      }
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar11) {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      paVar11->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2f0,": ");
      local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p == paVar11) {
        local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      }
      else {
        local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_310._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_310,
                      "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
      local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p == paVar11) {
        local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0," != -1");
      local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar12) {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_2b0);
      pbVar8 = extraout_RAX;
      paVar11 = extraout_RDX;
      goto LAB_00149c9b;
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,
                        "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p == paVar11) {
      local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    }
    else {
      local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_310._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_310,", line ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar11) {
      local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_290,(int *)&local_270);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar14 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_2d0._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar14 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_290._M_string_length + local_2d0._M_string_length)
      goto LAB_00149a74;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::replace
                         ((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
    }
    else {
LAB_00149a74:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_2d0,local_290._M_dataplus._M_p,local_290._M_string_length);
    }
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar11) {
      local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    paVar11->_M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,": ");
    local_e8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar11) {
      local_d8 = paVar11->_M_allocated_capacity;
      uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
    }
    else {
      local_d8 = paVar11->_M_allocated_capacity;
    }
    local_e0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_e8,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler != paVar11) goto LAB_0014a400;
    local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_180.sa_handler = (__sighandler_t)local_170;
  }
  paVar15 = &local_2d0.field_2;
  local_178 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort((string *)&local_180);
  pbVar8 = extraout_RAX_03;
  local_2d0._M_dataplus._M_p = (pointer)extraout_RDX_03;
  goto LAB_0014a437;
LAB_00148cf0:
  do {
    iVar7 = close(local_20c);
    if (iVar7 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar6;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_210;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_208);
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_50 != paVar15) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_290,
                      "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar11) {
    local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2f0,", line ");
  local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p == paVar11) {
    local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  }
  else {
    local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_310._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_250._M_dataplus._M_p._0_4_ = 0x5a3;
  StreamableToString<int>(&local_270,(int *)&local_250);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    uVar14 = local_310.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_270._M_string_length + local_310._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar14 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_270._M_string_length + local_310._M_string_length) goto LAB_00149148;
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_270,0,(char *)0x0,(ulong)local_310._M_dataplus._M_p);
  }
  else {
LAB_00149148:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_310,local_270._M_dataplus._M_p,local_270._M_string_length);
  }
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar11) {
    local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,": ");
  local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar11) {
    local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2b0,"close(pipe_fd[1])");
  local_e8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.sa_handler == paVar11) {
    local_d8 = paVar11->_M_allocated_capacity;
    uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
    local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
  }
  else {
    local_d8 = paVar11->_M_allocated_capacity;
  }
  local_e0 = (undefined1  [8])pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
                      ," != -1");
  local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != paVar12) goto LAB_00149cc9;
  local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
  local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  local_180.sa_handler = (__sighandler_t)local_170;
  goto LAB_00149cdc;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_00148c59:
    iVar7 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)0x0);
    if (iVar7 != -1) {
      if (iVar6 != -1) goto LAB_00148cf0;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,
                      "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
      local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar11) {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_290,", line ");
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar11) {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_230._M_dataplus._M_p._0_4_ = 0x574;
      StreamableToString<int>(&local_250,(int *)&local_230);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        uVar14 = local_2f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          uVar14 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length)
        goto LAB_00149c5e;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::replace
                           ((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
      }
      else {
LAB_00149c5e:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_2f0,local_250._M_dataplus._M_p,local_250._M_string_length);
      }
      local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p == paVar11) {
        local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      }
      else {
        local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_310._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      paVar11->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_310,": ");
      local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p == paVar11) {
        local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0,"child_pid != -1");
      local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar12 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar12) {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_2b0);
      pbVar8 = extraout_RAX_04;
      local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0014a58b;
    }
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_250,
                      "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
  local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p == paVar11) {
    local_270.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_270._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_270,", line ");
  local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar11) {
    local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p._0_4_ = 0x571;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar14 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar14 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length) goto LAB_0014909c;
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
  }
  else {
LAB_0014909c:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_290,local_230._M_dataplus._M_p,local_230._M_string_length);
  }
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar11) {
    local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2f0,": ");
  local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p == paVar11) {
    local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  }
  else {
    local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_310._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_310,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar11) {
    local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0," != -1");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if (paVar11 == paVar12) {
    local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
LAB_00149c9b:
    local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar11;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_2b0);
  pbVar8 = extraout_RAX_00;
  local_180 = extraout_RDX_00;
LAB_00149cc9:
  local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
LAB_00149cdc:
  local_178 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort((string *)&local_180);
  pbVar8 = extraout_RAX_01;
  paVar11 = extraout_RDX_01;
LAB_00149d00:
  local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  local_2f0._M_dataplus._M_p = (pointer)paVar11;
LAB_00149d0d:
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_230._M_dataplus._M_p._0_4_ = 0x552;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    uVar14 = local_2f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_250._M_string_length + local_2f0._M_string_length) goto LAB_00149d9a;
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
  }
  else {
LAB_00149d9a:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_2f0,local_250._M_dataplus._M_p,local_250._M_string_length);
  }
  local_310._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p == paVar11) {
    local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  }
  else {
    local_310.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_310._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_310,": ");
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar11) {
    local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
LAB_0014a437:
    local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,"stack != MAP_FAILED");
  local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar12) {
    local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0014a58b:
    local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_2b0);
  pbVar8 = extraout_RAX_05;
  paVar11 = extraout_RDX_05;
LAB_0014a5b9:
  local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar11;
LAB_0014a5c6:
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_2b0);
  pbVar8 = extraout_RAX_06;
  paVar11 = extraout_RDX_06;
LAB_0014a5e7:
  local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar11;
LAB_0014a5f4:
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_208);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_50 != paVar15) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}